

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# literal.cpp
# Opt level: O1

Literal * __thiscall wasm::Literal::internalize(Literal *__return_storage_ptr__,Literal *this)

{
  Type left;
  bool bVar1;
  HeapType HVar2;
  __shared_count<(__gnu_cxx::_Lock_policy)2> this_00;
  Type local_50;
  shared_ptr<wasm::GCData> local_48;
  shared_ptr<wasm::GCData> local_38;
  
  left.id = (this->type).id;
  wasm::Type::Type(&local_50,(HeapType)0x0,Nullable);
  bVar1 = wasm::Type::isSubType(left,local_50);
  if (!bVar1) {
    __assert_fail("Type::isSubType(type, Type(HeapType::ext, Nullable)) && \"can only internalize external references\""
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/wasm/literal.cpp"
                  ,0xa3e,"Literal wasm::Literal::internalize() const");
  }
  bVar1 = isNull(this);
  if (bVar1) {
    local_48.super___shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    local_48.super___shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    Literal(__return_storage_ptr__,&local_48,(HeapType)0xb);
    this_00._M_pi =
         local_48.super___shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  }
  else {
    local_38.super___shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (this->field_0).gcData.super___shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    if (((local_38.super___shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->type).id ==
        4) {
      HVar2 = wasm::Type::getHeapType
                        (&((local_38.super___shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2>.
                           _M_ptr)->values).super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].
                          type);
      if (HVar2.id == 4) {
        Literal(__return_storage_ptr__,
                (((this->field_0).gcData.
                  super___shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->values).
                super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems);
        return __return_storage_ptr__;
      }
      __assert_fail("gcData->values[0].type.getHeapType() == HeapType::i31",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/wasm/literal.cpp"
                    ,0xa43,"Literal wasm::Literal::internalize() const");
    }
    local_38.super___shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (this->field_0).gcData.super___shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2>.
         _M_refcount._M_pi;
    if (local_38.super___shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        (local_38.super___shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
        _M_use_count = (local_38.super___shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount._M_pi)->_M_use_count + 1;
        UNLOCK();
      }
      else {
        (local_38.super___shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
        _M_use_count = (local_38.super___shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount._M_pi)->_M_use_count + 1;
      }
    }
    Literal(__return_storage_ptr__,&local_38,
            (HeapType)
            (((this->field_0).gcData.super___shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr)->type).id);
    this_00._M_pi =
         local_38.super___shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  }
  if (this_00._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00._M_pi);
  }
  return __return_storage_ptr__;
}

Assistant:

Literal Literal::internalize() const {
  assert(Type::isSubType(type, Type(HeapType::ext, Nullable)) &&
         "can only internalize external references");
  if (isNull()) {
    return Literal(std::shared_ptr<GCData>{}, HeapType::none);
  }
  if (gcData->type == HeapType::i31) {
    assert(gcData->values[0].type.getHeapType() == HeapType::i31);
    return gcData->values[0];
  }
  return Literal(gcData, gcData->type);
}